

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
          (QMovableArrayOps<QWidgetItemData> *this,qsizetype i,QWidgetItemData *args)

{
  QWidgetItemData **ppQVar1;
  qsizetype *pqVar2;
  undefined8 *puVar3;
  Data *pDVar4;
  long lVar5;
  QWidgetItemData *pQVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QWidgetItemData tmp;
  Inserter local_80;
  int local_58;
  undefined4 uStack_54;
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
           d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0058cb90:
    _local_58 = CONCAT44(0xaaaaaaaa,args->role);
    aStack_50.shared = (args->value).d.data.shared;
    aStack_50._8_8_ = *(undefined8 *)((long)&(args->value).d.data + 8);
    aStack_50._16_8_ = *(undefined8 *)((long)&(args->value).d.data + 0x10);
    local_38 = *(undefined8 *)&(args->value).d.field_0x18;
    (args->value).d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
    *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
    *(undefined8 *)&(args->value).d.field_0x18 = 2;
    bVar10 = (this->super_QGenericArrayOps<QWidgetItemData>).
             super_QArrayDataPointer<QWidgetItemData>.size != 0;
    QArrayDataPointer<QWidgetItemData>::detachAndGrow
              ((QArrayDataPointer<QWidgetItemData> *)this,(uint)(i == 0 && bVar10),1,
               (QWidgetItemData **)0x0,(QArrayDataPointer<QWidgetItemData> *)0x0);
    if (i == 0 && bVar10) {
      pQVar6 = (this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
      pQVar6[-1].role = local_58;
      *(undefined8 *)((long)&pQVar6[-1].value.d.data + 0x10) = aStack_50._16_8_;
      *(undefined8 *)&pQVar6[-1].value.d.field_0x18 = local_38;
      pQVar6[-1].value.d.data.shared = aStack_50.shared;
      *(undefined8 *)((long)&pQVar6[-1].value.d.data + 8) = aStack_50._8_8_;
      aStack_50.shared = (PrivateShared *)0x0;
      aStack_50._8_8_ = 0;
      aStack_50._16_8_ = 0;
      local_38 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                 super_QArrayDataPointer<QWidgetItemData>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                super_QArrayDataPointer<QWidgetItemData>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_80.displaceTo =
           (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
           ptr;
      local_80.displaceFrom = local_80.displaceTo + i;
      local_80.displaceTo = local_80.displaceTo + i + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>
            .size - i) * 0x28;
      local_80.data = (QArrayDataPointer<QWidgetItemData> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      (local_80.displaceFrom)->role = local_58;
      *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 0x10) = aStack_50._16_8_;
      *(undefined8 *)&((local_80.displaceFrom)->value).d.field_0x18 = local_38;
      ((local_80.displaceFrom)->value).d.data.shared = aStack_50.shared;
      *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 8) = aStack_50._8_8_;
      aStack_50.shared = (PrivateShared *)0x0;
      aStack_50._8_8_ = 0;
      aStack_50._16_8_ = 0;
      local_38 = 2;
      local_80.displaceFrom = local_80.displaceFrom + 1;
      Inserter::~Inserter(&local_80);
    }
    ::QVariant::~QVariant((QVariant *)&aStack_50);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>
            .size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QWidgetItemData>).
                      super_QArrayDataPointer<QWidgetItemData>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar6 = (this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
      pQVar6[lVar5].role = args->role;
      pPVar7 = (args->value).d.data.shared;
      uVar8 = *(undefined8 *)((long)&(args->value).d.data + 8);
      uVar9 = *(undefined8 *)&(args->value).d.field_0x18;
      puVar3 = (undefined8 *)((long)&pQVar6[lVar5].value.d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(args->value).d.data + 0x10);
      puVar3[1] = uVar9;
      pQVar6[lVar5].value.d.data.shared = pPVar7;
      *(undefined8 *)((long)&pQVar6[lVar5].value.d.data + 8) = uVar8;
      (args->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
      *(undefined8 *)&(args->value).d.field_0x18 = 2;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QWidgetItemData *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
          ptr)) goto LAB_0058cb90;
      pQVar6 = (this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
      pQVar6[-1].role = args->role;
      pPVar7 = (args->value).d.data.shared;
      uVar8 = *(undefined8 *)((long)&(args->value).d.data + 8);
      uVar9 = *(undefined8 *)&(args->value).d.field_0x18;
      *(undefined8 *)((long)&pQVar6[-1].value.d.data + 0x10) =
           *(undefined8 *)((long)&(args->value).d.data + 0x10);
      *(undefined8 *)&pQVar6[-1].value.d.field_0x18 = uVar9;
      pQVar6[-1].value.d.data.shared = pPVar7;
      *(undefined8 *)((long)&pQVar6[-1].value.d.data + 8) = uVar8;
      (args->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
      *(undefined8 *)&(args->value).d.field_0x18 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                 super_QArrayDataPointer<QWidgetItemData>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
              super_QArrayDataPointer<QWidgetItemData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }